

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

void __thiscall duckdb::BoundLimitNode::Serialize(BoundLimitNode *this,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,100,"type");
  Serializer::WriteValue<duckdb::LimitNodeType>(serializer,this->type);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0x65,"constant_integer",&this->constant_integer);
  (*serializer->_vptr_Serializer[2])(serializer,0x66,"constant_percentage");
  (*serializer->_vptr_Serializer[0x1a])(this->constant_percentage,serializer);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0x67,"expression",&this->expression);
  return;
}

Assistant:

void BoundLimitNode::Serialize(Serializer &serializer) const {
	serializer.WriteProperty<LimitNodeType>(100, "type", type);
	serializer.WritePropertyWithDefault<idx_t>(101, "constant_integer", constant_integer);
	serializer.WriteProperty<double>(102, "constant_percentage", constant_percentage);
	serializer.WritePropertyWithDefault<unique_ptr<Expression>>(103, "expression", expression);
}